

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# in_memory_log_store.cxx
# Opt level: O0

void __thiscall nuraft::inmem_log_store::inmem_log_store(inmem_log_store *this)

{
  mapped_type *__r;
  log_store *in_RDI;
  ptr<buffer> buf;
  size_t in_stack_000000c8;
  nullptr_t in_stack_ffffffffffffff78;
  EventAwaiter *this_00;
  log_store *args;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 uVar1;
  
  log_store::log_store(in_RDI);
  in_RDI->_vptr_log_store = (_func_int **)&PTR__inmem_log_store_006dfbb0;
  this_00 = (EventAwaiter *)(in_RDI + 1);
  std::
  map<unsigned_long,_std::shared_ptr<nuraft::log_entry>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<nuraft::log_entry>_>_>_>
  ::map((map<unsigned_long,_std::shared_ptr<nuraft::log_entry>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<nuraft::log_entry>_>_>_>
         *)0x1a2ea2);
  std::mutex::mutex((mutex *)0x1a2eb0);
  std::atomic<unsigned_long>::atomic
            ((atomic<unsigned_long> *)this_00,(__integral_type)in_stack_ffffffffffffff78);
  in_RDI[0xd]._vptr_log_store = (_func_int **)0x0;
  std::atomic<unsigned_long>::atomic
            ((atomic<unsigned_long> *)this_00,(__integral_type)in_stack_ffffffffffffff78);
  args = in_RDI + 0xf;
  std::
  map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  ::map((map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
         *)0x1a2ef9);
  std::unique_ptr<std::thread,std::default_delete<std::thread>>::
  unique_ptr<std::default_delete<std::thread>,void>
            ((unique_ptr<std::thread,_std::default_delete<std::thread>_> *)this_00,
             in_stack_ffffffffffffff78);
  std::atomic<bool>::atomic
            ((atomic<bool> *)this_00,SUB81((ulong)in_stack_ffffffffffffff78 >> 0x38,0));
  EventAwaiter::EventAwaiter(this_00);
  std::atomic<unsigned_long>::atomic
            ((atomic<unsigned_long> *)this_00,(__integral_type)in_stack_ffffffffffffff78);
  nuraft::buffer::alloc(in_stack_000000c8);
  uVar1 = 0;
  cs_new<nuraft::log_entry,int,std::shared_ptr<nuraft::buffer>&>
            ((int *)args,(shared_ptr<nuraft::buffer> *)this_00);
  __r = std::
        map<unsigned_long,_std::shared_ptr<nuraft::log_entry>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<nuraft::log_entry>_>_>_>
        ::operator[]((map<unsigned_long,_std::shared_ptr<nuraft::log_entry>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<nuraft::log_entry>_>_>_>
                      *)CONCAT44(uVar1,in_stack_ffffffffffffffc0),(key_type *)0x0);
  std::shared_ptr<nuraft::log_entry>::operator=((shared_ptr<nuraft::log_entry> *)this_00,__r);
  std::shared_ptr<nuraft::log_entry>::~shared_ptr((shared_ptr<nuraft::log_entry> *)0x1a2fbf);
  std::shared_ptr<nuraft::buffer>::~shared_ptr((shared_ptr<nuraft::buffer> *)0x1a2fc9);
  return;
}

Assistant:

inmem_log_store::inmem_log_store()
    : start_idx_(1)
    , raft_server_bwd_pointer_(nullptr)
    , disk_emul_delay(0)
    , disk_emul_thread_(nullptr)
    , disk_emul_thread_stop_signal_(false)
    , disk_emul_last_durable_index_(0)
{
    // Dummy entry for index 0.
    ptr<buffer> buf = buffer::alloc(sz_ulong);
    logs_[0] = cs_new<log_entry>(0, buf);
}